

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

Index __thiscall
MADPComponentDiscreteObservations::JointToRestrictedJointObservationIndex
          (MADPComponentDiscreteObservations *this,Index joI,Scope *agSc_e)

{
  Index IVar1;
  Scope *agSC;
  allocator_type *__a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  undefined4 in_ESI;
  Index in_stack_00000014;
  MADPComponentDiscreteObservations *in_stack_00000018;
  Index jo_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jo_vec_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *jo_vec;
  Scope *sc;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Scope local_39;
  undefined4 in_stack_fffffffffffffff0;
  
  agSC = (Scope *)JointToIndividualObservationIndices(in_stack_00000018,in_stack_00000014);
  __a = (allocator_type *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  sc = &local_39;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xad44d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(size_type)sc,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xad44f8);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),sc,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  IVar1 = IndividualToJointObservationIndices
                    ((MADPComponentDiscreteObservations *)CONCAT44(in_ESI,in_stack_fffffffffffffff0)
                     ,in_RDX,agSC);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  return IVar1;
}

Assistant:

Index MADPComponentDiscreteObservations::
JointToRestrictedJointObservationIndex(
        Index joI, const Scope& agSc_e ) const
{
    const vector<Index>& jo_vec = JointToIndividualObservationIndices(joI);
    vector<Index> jo_vec_e(agSc_e.size());
    IndexTools::RestrictIndividualIndicesToScope(jo_vec, agSc_e, jo_vec_e);
    Index jo_e = IndividualToJointObservationIndices(jo_vec_e, agSc_e);
    return(jo_e);

}